

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

Result<wallet::CreatedTransactionResult> *
wallet::FundTransaction
          (Result<wallet::CreatedTransactionResult> *__return_storage_ptr__,CWallet *wallet,
          CMutableTransaction *tx,
          vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *vecSend,
          optional<unsigned_int> change_pos,bool lockUnspents,CCoinControl *coinControl)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pCVar3;
  Chain *pCVar4;
  element_type *peVar5;
  COutPoint *outpoint;
  isminetype iVar6;
  PreselectedInput *this;
  mapped_type *pmVar7;
  CTxOut *txout;
  T *pTVar8;
  CTxIn *txin;
  pointer pCVar9;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  CScriptWitness *script_wit;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  coins;
  char *local_c0;
  unique_lock<std::recursive_mutex> local_b8;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined8 uStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start !=
      (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    __assert_fail("tx.vout.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/spend.cpp"
                  ,0x58d,
                  "util::Result<CreatedTransactionResult> wallet::FundTransaction(CWallet &, const CMutableTransaction &, const std::vector<CRecipient> &, std::optional<unsigned int>, bool, CCoinControl)"
                 );
  }
  (coinControl->m_locktime).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_payload_base<unsigned_int>)((ulong)tx->nLockTime | 0x100000000);
  (coinControl->m_version).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_payload_base<unsigned_int>)((ulong)tx->version | 0x100000000);
  local_b8._M_device = &(wallet->cs_wallet).super_recursive_mutex;
  local_b8._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_b8);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar9 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pCVar9 != pCVar3) {
    do {
      std::
      map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
      ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    *)&local_68,&pCVar9->prevout);
      pCVar9 = pCVar9 + 1;
    } while (pCVar9 != pCVar3);
  }
  pCVar4 = wallet->m_chain;
  if (pCVar4 == (Chain *)0x0) {
    __assert_fail("m_chain",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
  }
  (*pCVar4->_vptr_Chain[0xf])(pCVar4,&local_68);
  pCVar9 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar9 != pCVar3) {
    script_wit = &pCVar9->scriptWitness;
    do {
      outpoint = (COutPoint *)((long)(script_wit + -4) + 0x10);
      this = CCoinControl::Select(coinControl,outpoint);
      iVar6 = CWallet::IsMine(wallet,outpoint);
      if (iVar6 == ISMINE_NO) {
        pmVar7 = std::
                 map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                 ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                               *)&local_68,outpoint);
        if ((pmVar7->out).nValue == -1) {
          local_a8 = &local_98;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"Unable to find UTXO for external input","");
          paVar2 = &local_88.field_2;
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_88._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_88,"Unable to find UTXO for external input","");
          }
          else {
            local_c0 = "Unable to find UTXO for external input";
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      (&local_88,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_c0);
          }
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>
                           .
                           super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>
                           .super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>
                           ._M_u + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->m_variant).
            super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult> = puVar1;
          if (local_a8 == &local_98) {
            *puVar1 = CONCAT71(uStack_97,local_98);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     _M_u + 0x18) = uStack_90;
          }
          else {
            *(undefined1 **)
             &(__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
              super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
              super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
              super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
              super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
              super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult> =
                 local_a8;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                              super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>
                              .
                              super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>
                              .
                              super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>
                              .
                              super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>
                              .
                              super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>
                              ._M_u + 0x10) = CONCAT71(uStack_97,local_98);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   _M_u + 8) = local_a0;
          local_a0 = 0;
          local_98 = 0;
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>
                           .
                           super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>
                           .super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>
                           ._M_u + 0x30);
          *(undefined8 **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   _M_u + 0x20) = puVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p == paVar2) {
            *puVar1 = CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                               local_88.field_2._M_local_buf[0]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     _M_u + 0x38) = local_88.field_2._8_8_;
          }
          else {
            *(pointer *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     _M_u + 0x20) = local_88._M_dataplus._M_p;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                              super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>
                              .
                              super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>
                              .
                              super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>
                              .
                              super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>
                              .
                              super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>
                              ._M_u + 0x30) =
                 CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                          local_88.field_2._M_local_buf[0]);
          }
          *(size_type *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                   _M_u + 0x28) = local_88._M_string_length;
          local_88._M_string_length = 0;
          local_88.field_2._M_local_buf[0] = '\0';
          (__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_index =
               '\0';
          local_a8 = &local_98;
          local_88._M_dataplus._M_p = (pointer)paVar2;
          goto LAB_005129d3;
        }
        txout = &std::
                 map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                 ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                               *)&local_68,outpoint)->out;
        PreselectedInput::SetTxOut(this,txout);
      }
      PreselectedInput::SetSequence(this,*(uint32_t *)((long)(script_wit + -1) + 0x10));
      PreselectedInput::SetScriptSig(this,(CScript *)((long)(script_wit + -2) + 8));
      PreselectedInput::SetScriptWitness(this,script_wit);
      pCVar9 = (pointer)(script_wit + 1);
      script_wit = (CScriptWitness *)((long)(script_wit + 4) + 8);
    } while (pCVar9 != pCVar3);
  }
  CreateTransaction(__return_storage_ptr__,wallet,vecSend,change_pos,coinControl,false);
  if (lockUnspents &&
      (__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_index ==
      '\x01') {
    pTVar8 = util::Result<wallet::CreatedTransactionResult>::value(__return_storage_ptr__);
    peVar5 = (pTVar8->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pCVar3 = (peVar5->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar9 = (peVar5->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start; pCVar9 != pCVar3; pCVar9 = pCVar9 + 1) {
      CWallet::LockCoin(wallet,&pCVar9->prevout,(WalletBatch *)0x0);
    }
  }
LAB_005129d3:
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  ::~_Rb_tree(&local_68);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<CreatedTransactionResult> FundTransaction(CWallet& wallet, const CMutableTransaction& tx, const std::vector<CRecipient>& vecSend, std::optional<unsigned int> change_pos, bool lockUnspents, CCoinControl coinControl)
{
    // We want to make sure tx.vout is not used now that we are passing outputs as a vector of recipients.
    // This sets us up to remove tx completely in a future PR in favor of passing the inputs directly.
    assert(tx.vout.empty());

    // Set the user desired locktime
    coinControl.m_locktime = tx.nLockTime;

    // Set the user desired version
    coinControl.m_version = tx.version;

    // Acquire the locks to prevent races to the new locked unspents between the
    // CreateTransaction call and LockCoin calls (when lockUnspents is true).
    LOCK(wallet.cs_wallet);

    // Fetch specified UTXOs from the UTXO set to get the scriptPubKeys and values of the outputs being selected
    // and to match with the given solving_data. Only used for non-wallet outputs.
    std::map<COutPoint, Coin> coins;
    for (const CTxIn& txin : tx.vin) {
        coins[txin.prevout]; // Create empty map entry keyed by prevout.
    }
    wallet.chain().findCoins(coins);

    for (const CTxIn& txin : tx.vin) {
        const auto& outPoint = txin.prevout;
        PreselectedInput& preset_txin = coinControl.Select(outPoint);
        if (!wallet.IsMine(outPoint)) {
            if (coins[outPoint].out.IsNull()) {
                return util::Error{_("Unable to find UTXO for external input")};
            }

            // The input was not in the wallet, but is in the UTXO set, so select as external
            preset_txin.SetTxOut(coins[outPoint].out);
        }
        preset_txin.SetSequence(txin.nSequence);
        preset_txin.SetScriptSig(txin.scriptSig);
        preset_txin.SetScriptWitness(txin.scriptWitness);
    }

    auto res = CreateTransaction(wallet, vecSend, change_pos, coinControl, false);
    if (!res) {
        return res;
    }

    if (lockUnspents) {
        for (const CTxIn& txin : res->tx->vin) {
            wallet.LockCoin(txin.prevout);
        }
    }

    return res;
}